

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::GenerateImportPrefix(cmExportInstallFileGenerator *this,ostream *os)

{
  bool bVar1;
  byte bVar2;
  cmLocalGenerator *this_00;
  cmMakefile *this_01;
  string *psVar3;
  ostream *poVar4;
  string local_118;
  undefined1 local_f8 [8];
  string dest;
  string absDestS;
  undefined1 local_98 [8];
  string absDest;
  string *expDest;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string installPrefix;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  installPrefix.field_2._8_8_ = os;
  this_00 = cmInstallExportGenerator::GetLocalGenerator(this->IEGen);
  this_01 = cmLocalGenerator::GetMakefile(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_INSTALL_PREFIX",&local_59);
  psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_58);
  std::__cxx11::string::string((string *)local_38,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  absDest.field_2._8_8_ = cmInstallExportGenerator::GetDestination_abi_cxx11_(this->IEGen);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)absDest.field_2._8_8_);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)installPrefix.field_2._8_8_,
                             "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)local_38);
    std::operator<<(poVar4,"\")\n\n");
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&absDestS.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"/"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&absDestS.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   absDest.field_2._8_8_);
    std::__cxx11::string::~string((string *)(absDestS.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dest.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"/"
                  );
    poVar4 = std::operator<<((ostream *)installPrefix.field_2._8_8_,
                             "# Compute the installation prefix relative to this file.\n");
    poVar4 = std::operator<<(poVar4,"get_filename_component(_IMPORT_PREFIX");
    std::operator<<(poVar4," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dest.field_2 + 8),(char (*) [6])0x832303);
    if ((((bVar1) ||
         (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&dest.field_2 + 8),(char (*) [8])0x83230d), bVar1)) ||
        (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,9ul>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&dest.field_2 + 8),(char (*) [9])0x832319), bVar1)) ||
       (((bVar1 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&dest.field_2 + 8),(char (*) [10])"/usr/lib/"), bVar1 ||
         (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,12ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&dest.field_2 + 8),(char (*) [12])"/usr/lib64/"), bVar1)) ||
        (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,13ul>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&dest.field_2 + 8),(char (*) [13])"/usr/libx32/"), bVar1)))) {
      poVar4 = std::operator<<((ostream *)installPrefix.field_2._8_8_,
                               "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                              );
      poVar4 = std::operator<<(poVar4,(string *)local_98);
      poVar4 = std::operator<<(poVar4,
                               "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                              );
      poVar4 = std::operator<<(poVar4,(string *)local_98);
      std::operator<<(poVar4,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
    }
    std::__cxx11::string::string((string *)local_f8,(string *)absDest.field_2._8_8_);
    while (bVar2 = std::__cxx11::string::empty(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::operator<<((ostream *)installPrefix.field_2._8_8_,
                      "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n");
      cmsys::SystemTools::GetFilenamePath(&local_118,(string *)local_f8);
      std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    poVar4 = std::operator<<((ostream *)installPrefix.field_2._8_8_,
                             "if(_IMPORT_PREFIX STREQUAL \"/\")\n");
    poVar4 = std::operator<<(poVar4,"  set(_IMPORT_PREFIX \"\")\n");
    poVar4 = std::operator<<(poVar4,"endif()\n");
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)(dest.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_98);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportPrefix(std::ostream& os)
{
  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetLocalGenerator()->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if (cmSystemTools::FileIsFullPath(expDest)) {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    /* clang-format off */
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    /* clang-format on */
  } else {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if (cmHasLiteralPrefix(absDestS, "/lib/") ||
        cmHasLiteralPrefix(absDestS, "/lib64/") ||
        cmHasLiteralPrefix(absDestS, "/libx32/") ||
        cmHasLiteralPrefix(absDestS, "/usr/lib/") ||
        cmHasLiteralPrefix(absDestS, "/usr/lib64/") ||
        cmHasLiteralPrefix(absDestS, "/usr/libx32/")) {
      // Handle "/usr move" symlinks created by some Linux distros.
      /* clang-format off */
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      /* clang-format on */
    }
    std::string dest = expDest;
    while (!dest.empty()) {
      os << "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" "
            "PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
    }
    os << "if(_IMPORT_PREFIX STREQUAL \"/\")\n"
       << "  set(_IMPORT_PREFIX \"\")\n"
       << "endif()\n"
       << "\n";
  }
}